

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResolvingDecoder.cc
# Opt level: O2

size_t __thiscall
avro::parsing::
ResolvingDecoderImpl<avro::parsing::SimpleParser<avro::parsing::ResolvingDecoderHandler>_>::
arrayNext(ResolvingDecoderImpl<avro::parsing::SimpleParser<avro::parsing::ResolvingDecoderHandler>_>
          *this)

{
  SimpleParser<avro::parsing::ResolvingDecoderHandler> *this_00;
  int iVar1;
  undefined4 extraout_var;
  size_t n;
  
  this_00 = &this->parser_;
  SimpleParser<avro::parsing::ResolvingDecoderHandler>::processImplicitActions(this_00);
  iVar1 = (*((this->base_).px)->_vptr_Decoder[0x11])();
  n = CONCAT44(extraout_var,iVar1);
  if (n == 0) {
    SimpleParser<avro::parsing::ResolvingDecoderHandler>::popRepeater(this_00);
    SimpleParser<avro::parsing::ResolvingDecoderHandler>::advance(this_00,sArrayEnd);
  }
  else {
    SimpleParser<avro::parsing::ResolvingDecoderHandler>::setRepeatCount(this_00,n);
  }
  return n;
}

Assistant:

size_t ResolvingDecoderImpl<P>::arrayNext()
{
    parser_.processImplicitActions();
    size_t result = base_->arrayNext();
    if (result == 0) {
        parser_.popRepeater();
        parser_.advance(Symbol::sArrayEnd);
    } else {
        parser_.setRepeatCount(result);
    }
    return result;
}